

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

int ixmlNode_replaceChild
              (IXML_Node_conflict *nodeptr,IXML_Node_conflict *newChild,IXML_Node_conflict *oldChild
              ,IXML_Node_conflict **returnNode)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0x69;
  if (oldChild != (IXML_Node_conflict *)0x0 &&
      (newChild != (IXML_Node_conflict *)0x0 && nodeptr != (IXML_Node_conflict *)0x0)) {
    iVar1 = ixmlNode_isAncestor(newChild,nodeptr);
    iVar2 = 3;
    if (iVar1 == 0) {
      iVar1 = ixmlNode_allowChildren(nodeptr,newChild);
      if (((iVar1 != 0) && (iVar2 = 4, nodeptr->ownerDocument == newChild->ownerDocument)) &&
         (iVar2 = 8, oldChild->parentNode == nodeptr)) {
        iVar2 = ixmlNode_insertBefore(nodeptr,newChild,oldChild);
        if (iVar2 == 0) {
          iVar2 = ixmlNode_removeChild(nodeptr,oldChild,returnNode);
          return iVar2;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int ixmlNode_replaceChild(IXML_Node *nodeptr,
	IXML_Node *newChild,
	IXML_Node *oldChild,
	IXML_Node **returnNode)
{
	int ret = IXML_SUCCESS;

	if (nodeptr == NULL || newChild == NULL || oldChild == NULL) {
		return IXML_INVALID_PARAMETER;
	}
	/* if nodetype of nodeptr does not allow children of the type of
	 * newChild needs to add later or if newChild is one of nodeptr's
	 * ancestors */
	if (ixmlNode_isAncestor(newChild, nodeptr)) {
		return IXML_HIERARCHY_REQUEST_ERR;
	}

	if (ixmlNode_allowChildren(nodeptr, newChild) == 0) {
		return IXML_HIERARCHY_REQUEST_ERR;
	}
	/* if newChild was created from a different document */
	if (nodeptr->ownerDocument != newChild->ownerDocument) {
		return IXML_WRONG_DOCUMENT_ERR;
	}
	/* if refChild is not a child of nodeptr */
	if (ixmlNode_isParent(nodeptr, oldChild) != 1) {
		return IXML_NOT_FOUND_ERR;
	}

	ret = ixmlNode_insertBefore(nodeptr, newChild, oldChild);
	if (ret != IXML_SUCCESS) {
		return ret;
	}

	ret = ixmlNode_removeChild(nodeptr, oldChild, returnNode);
	return ret;
}